

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-barrier.c
# Opt level: O3

int run_test_barrier_2(void)

{
  int iVar1;
  undefined8 *unaff_RBX;
  undefined1 *puVar2;
  long lVar3;
  uv_thread_t thread;
  worker_config wc;
  undefined1 auStack_e8 [32];
  undefined1 auStack_c8 [32];
  undefined8 *puStack_a8;
  undefined1 auStack_88 [8];
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  uint uStack_58;
  uint uStack_54;
  code *pcStack_50;
  undefined1 local_40 [8];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  uint uStack_10;
  uint uStack_c;
  
  uStack_10 = 0;
  uStack_c = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_18 = 100;
  pcStack_50 = (code *)0x14c57e;
  iVar1 = uv_barrier_init(&local_38,2);
  if (iVar1 == 0) {
    pcStack_50 = (code *)0x14c598;
    iVar1 = uv_thread_create(local_40,worker,&local_38);
    if (iVar1 != 0) goto LAB_0014c5df;
    unaff_RBX = &local_38;
    pcStack_50 = (code *)0x14c5a9;
    uStack_10 = uv_barrier_wait(unaff_RBX);
    pcStack_50 = (code *)0x14c5b6;
    iVar1 = uv_thread_join(local_40);
    if (iVar1 != 0) goto LAB_0014c5e4;
    unaff_RBX = &local_38;
    pcStack_50 = (code *)0x14c5c7;
    uv_barrier_destroy(unaff_RBX);
    if ((uStack_c ^ uStack_10) == 1) {
      return 0;
    }
  }
  else {
    pcStack_50 = (code *)0x14c5df;
    run_test_barrier_2_cold_1();
LAB_0014c5df:
    pcStack_50 = (code *)0x14c5e4;
    run_test_barrier_2_cold_2();
LAB_0014c5e4:
    pcStack_50 = (code *)0x14c5e9;
    run_test_barrier_2_cold_3();
  }
  pcStack_50 = run_test_barrier_3;
  run_test_barrier_2_cold_4();
  uStack_60 = 0;
  uStack_58 = 0;
  uStack_54 = 0;
  uStack_70 = 0;
  uStack_68 = 0;
  uStack_80 = 0;
  uStack_78 = 0;
  pcStack_50 = (code *)unaff_RBX;
  iVar1 = uv_barrier_init(&uStack_80,2);
  if (iVar1 == 0) {
    iVar1 = uv_thread_create(auStack_88,worker,&uStack_80);
    if (iVar1 != 0) goto LAB_0014c671;
    unaff_RBX = &uStack_80;
    uStack_58 = uv_barrier_wait(unaff_RBX);
    iVar1 = uv_thread_join(auStack_88);
    if (iVar1 == 0) {
      unaff_RBX = &uStack_80;
      uv_barrier_destroy(unaff_RBX);
      if ((uStack_54 ^ uStack_58) == 1) {
        return 0;
      }
      goto LAB_0014c67b;
    }
  }
  else {
    run_test_barrier_3_cold_1();
LAB_0014c671:
    run_test_barrier_3_cold_2();
  }
  run_test_barrier_3_cold_3();
LAB_0014c67b:
  run_test_barrier_3_cold_4();
  puVar2 = auStack_e8;
  puStack_a8 = unaff_RBX;
  iVar1 = uv_barrier_init(auStack_e8,5);
  if (iVar1 == 0) {
    lVar3 = 0;
    do {
      puVar2 = auStack_c8 + lVar3;
      iVar1 = uv_thread_create(puVar2,serial_worker,auStack_e8);
      if (iVar1 != 0) {
        run_test_barrier_serial_thread_cold_2();
        goto LAB_0014c70a;
      }
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x20);
    iVar1 = uv_barrier_wait(auStack_e8);
    if (0 < iVar1) {
      uv_barrier_destroy(auStack_e8);
    }
    lVar3 = 0;
    while( true ) {
      puVar2 = auStack_c8 + lVar3;
      iVar1 = uv_thread_join(puVar2);
      if (iVar1 != 0) break;
      lVar3 = lVar3 + 8;
      if (lVar3 == 0x20) {
        return 0;
      }
    }
LAB_0014c70a:
    run_test_barrier_serial_thread_cold_3();
  }
  run_test_barrier_serial_thread_cold_1();
  iVar1 = uv_barrier_wait();
  if (0 < iVar1) {
    uv_barrier_destroy(puVar2);
  }
  iVar1 = uv_sleep(100);
  return iVar1;
}

Assistant:

TEST_IMPL(barrier_2) {
  uv_thread_t thread;
  worker_config wc;

  memset(&wc, 0, sizeof(wc));
  wc.delay = 100;

  ASSERT(0 == uv_barrier_init(&wc.barrier, 2));
  ASSERT(0 == uv_thread_create(&thread, worker, &wc));

  wc.main_barrier_wait_rval = uv_barrier_wait(&wc.barrier);

  ASSERT(0 == uv_thread_join(&thread));
  uv_barrier_destroy(&wc.barrier);

  ASSERT(1 == (wc.main_barrier_wait_rval ^ wc.worker_barrier_wait_rval));

  return 0;
}